

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O0

void Instruction::load(string *filename)

{
  bool bVar1;
  int size_00;
  istream *piVar2;
  unsigned_long uVar3;
  ulong uVar4;
  Instruction *pIVar5;
  Instruction *instr;
  string text;
  string local_298 [4];
  int size;
  string tmp;
  string local_278 [32];
  unsigned_long local_258;
  Addr addr;
  size_t n;
  string local_238 [8];
  string line;
  istream local_218 [8];
  ifstream input;
  string *filename_local;
  
  std::ifstream::ifstream(local_218,(string *)filename,_S_in);
  std::__cxx11::string::string(local_238);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_238);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    addr = std::__cxx11::string::find((char)local_238,0x3a);
    if (addr != 0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)local_278,(ulong)local_238);
      uVar3 = std::__cxx11::stoul(local_278,(size_t *)0x0,0x10);
      std::__cxx11::string::~string((string *)local_278);
      local_258 = uVar3;
      if (uVar3 != 0) {
        std::__cxx11::string::substr((ulong)local_298,(ulong)local_238);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          addr = std::__cxx11::string::find((char)local_298,0x3a);
          if (addr == 0xffffffffffffffff) {
            n._0_4_ = 3;
          }
          else {
            size_00 = std::__cxx11::stoi(local_298,(size_t *)0x0,10);
            if (size_00 < 1) {
              n._0_4_ = 3;
            }
            else {
              std::__cxx11::string::substr((ulong)&instr,(ulong)local_298);
              uVar4 = std::__cxx11::string::empty();
              if ((uVar4 & 1) == 0) {
                pIVar5 = get(local_258,size_00);
                std::__cxx11::string::operator=((string *)&pIVar5->m_text,(string *)&instr);
                n._0_4_ = 0;
              }
              else {
                n._0_4_ = 3;
              }
              std::__cxx11::string::~string((string *)&instr);
            }
          }
        }
        else {
          n._0_4_ = 3;
        }
        std::__cxx11::string::~string((string *)local_298);
      }
    }
  }
  n._0_4_ = 2;
  std::__cxx11::string::~string(local_238);
  std::ifstream::close();
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void Instruction::load(std::string filename) {
	std::ifstream input(filename);

	for (std::string line; getline(input, line); ) {
		std::size_t n = line.find(':');
		if (n == std::string::npos)
			continue;

		Addr addr = std::stoul(line.substr(0, n), 0, 16);
		if (addr == 0)
			continue;

		std::string tmp = line.substr(n+1);
		if (tmp.empty())
			continue;

		n = tmp.find(':');
		if (n == std::string::npos)
			continue;

		int size = std::stoi(tmp);
		if (size <= 0)
			continue;

		std::string text = tmp.substr(n+1);
		if (text.empty())
			continue;

		Instruction* instr = Instruction::get(addr, size);
		instr->m_text = text;
	}

	input.close();
}